

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

Abc_Ntk_t * Abc_SclUnBufferPerform(Abc_Ntk_t *pNtk,int fVerbose)

{
  int nCap;
  void *pvVar1;
  Abc_Obj_t *pObj;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pFanin;
  Abc_Ntk_t *pAVar5;
  long lVar6;
  int iVar7;
  uint i;
  
  nCap = pNtk->vObjs->nSize;
  p = Vec_IntAlloc(nCap);
  p->nSize = nCap;
  memset(p->pArray,0xff,(long)nCap << 2);
  for (iVar7 = 0; iVar2 = pNtk->vObjs->nSize, iVar7 < iVar2; iVar7 = iVar7 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar7);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) &&
       (iVar2 = Abc_SclIsInv(pAVar4), iVar2 != 0)) {
      iVar2 = *(pAVar4->vFanins).pArray;
      pvVar1 = pAVar4->pNtk->vObjs->pArray[iVar2];
      if (((*(uint *)((long)pvVar1 + 0x14) & 0xf) != 7) || (*(int *)((long)pvVar1 + 0x1c) != 1)) {
        Vec_IntWriteEntry(p,iVar2,pAVar4->Id);
      }
    }
  }
  for (iVar7 = 0; iVar7 < iVar2; iVar7 = iVar7 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar7);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (uVar3 = *(uint *)&pAVar4->field_0x14 & 0xf, uVar3 < 8)) &&
       ((0x98U >> uVar3 & 1) != 0)) {
      if (nCap <= iVar7) break;
      for (lVar6 = 0; lVar6 < (pAVar4->vFanins).nSize; lVar6 = lVar6 + 1) {
        pObj = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar6]];
        if (((*(uint *)&pObj->field_0x14 & 0xf) == 7) && ((pObj->vFanins).nSize == 1)) {
          uVar3 = Abc_SclGetRealFaninLit(pObj);
          i = uVar3 >> 1;
          pFanin = Abc_NtkObj(pNtk,i);
          if ((uVar3 & 1) != 0) {
            iVar2 = Vec_IntEntry(p,i);
            if (iVar2 == -1) {
              pFanin = Abc_NtkCreateNodeInv(pNtk,pFanin);
              Vec_IntWriteEntry(p,i,pFanin->Id);
            }
            else {
              iVar2 = Vec_IntEntry(p,i);
              pFanin = Abc_NtkObj(pNtk,iVar2);
            }
            if ((pFanin->vFanins).nSize != 1) {
              __assert_fail("Abc_ObjFaninNum(pFaninNew) == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBuffer.c"
                            ,0x9f,"Abc_Ntk_t *Abc_SclUnBufferPerform(Abc_Ntk_t *, int)");
            }
          }
          if (pObj != pFanin) {
            Abc_ObjPatchFanin(pAVar4,pObj,pFanin);
          }
        }
      }
    }
    iVar2 = pNtk->vObjs->nSize;
  }
  Vec_IntFree(p);
  pAVar5 = Abc_NtkDupDfs(pNtk);
  return pAVar5;
}

Assistant:

Abc_Ntk_t * Abc_SclUnBufferPerform( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Int_t * vLits;
    Abc_Obj_t * pObj, * pFanin, * pFaninNew;
    int i, k, iLit, nNodesOld = Abc_NtkObjNumMax(pNtk);
    // assign inverters
    vLits = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Abc_SclIsInv(pObj) && !Abc_SclObjIsBufInv(Abc_ObjFanin0(pObj)) )
            Vec_IntWriteEntry( vLits, Abc_ObjFaninId0(pObj), Abc_ObjId(pObj) );
    // transfer fanins
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        if ( i >= nNodesOld )
            break;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( !Abc_SclObjIsBufInv(pFanin) )
                continue;
            iLit = Abc_SclGetRealFaninLit( pFanin );
            pFaninNew = Abc_NtkObj( pNtk, Abc_Lit2Var(iLit) );
            if ( Abc_LitIsCompl(iLit) )
            {
                if ( Vec_IntEntry( vLits, Abc_Lit2Var(iLit) ) == -1 )
                {
                    pFaninNew = Abc_NtkCreateNodeInv( pNtk, pFaninNew );
                    Vec_IntWriteEntry( vLits, Abc_Lit2Var(iLit), Abc_ObjId(pFaninNew) );
                }
                else
                    pFaninNew = Abc_NtkObj( pNtk, Vec_IntEntry( vLits, Abc_Lit2Var(iLit) ) );
                assert( Abc_ObjFaninNum(pFaninNew) == 1 );
            }
            if ( pFanin != pFaninNew )
                Abc_ObjPatchFanin( pObj, pFanin, pFaninNew );
        }
    }
    Vec_IntFree( vLits );
    // duplicate network in topo order
    return Abc_NtkDupDfs( pNtk );
}